

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O1

double __thiscall FIR::filter(FIR *this,double x)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  iVar1 = this->taps;
  lVar3 = (long)iVar1;
  lVar4 = lVar3;
  if (1 < lVar3) {
    do {
      if (lVar4 + -2 < (long)this->taps) {
        fVar5 = (this->buff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4 + -2];
      }
      else {
        puts("\nThat value does not exist");
        fVar5 = 0.0;
      }
      if (this->taps < lVar4) {
        puts("\nThat index for the buffer does not exist");
      }
      else {
        (this->buff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4 + -1] = fVar5;
      }
      bVar2 = 2 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar2);
  }
  if (this->taps < 1) {
    puts("\nThat index for the buffer does not exist");
  }
  else {
    *(this->buff).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_start = (float)x;
  }
  dVar7 = 0.0;
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      if (lVar4 < this->taps) {
        dVar8 = (double)(this->buff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4];
      }
      else {
        puts("\nThat value does not exist");
        dVar8 = 0.0;
      }
      if (lVar4 < this->taps) {
        dVar6 = (double)(this->coeff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4];
      }
      else {
        puts("\nThat coefficient does not exist");
        dVar6 = 0.0;
      }
      dVar7 = dVar7 + dVar8 * dVar6;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return dVar7;
}

Assistant:

double FIR::filter(double x){

	double output=0.0;
	
	int M = this->getTaps();

	for (int i=M-1; i>0; i--){this->setBuffer(this->getBuffer(i-1),i);}
	
	this->setBuffer(x,0);
	
	for (int i=0; i<M; i++){output+=(this->getBuffer(i))*(this->getCoeff(i));}

	return output;	

}